

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O1

VRDisplayNode *
MinVR::VRGraphicsWindowNode::create(VRMainInterface *vrMain,VRDataIndex *config,string *nameSpace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  VRGraphicsToolkit *gfxToolkit;
  int iVar4;
  VRAnyCoreType VVar5;
  undefined4 extraout_var;
  ostream *poVar6;
  undefined4 extraout_var_00;
  VRGraphicsWindowNode *this;
  VRWindowSettings settings;
  string nodeNameSpace;
  string wtk;
  string gtk;
  string local_448;
  string local_428;
  undefined1 local_408 [24];
  string local_3f0 [8];
  size_type local_3e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  bool local_3d0;
  bool local_3cf;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  bool local_3b0;
  bool local_3af;
  bool local_3ae;
  bool local_3ad;
  bool local_3ac;
  int local_3a8;
  long *local_3a0;
  long local_398;
  long local_390 [2];
  VRWindowToolkit *local_380;
  VRGraphicsToolkit *local_378;
  long *local_370;
  long local_368;
  long local_360 [2];
  long *local_350;
  long local_348;
  long local_340 [2];
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_3a0 = local_390;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3a0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  pcVar2 = local_408 + 0x10;
  local_408._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"GraphicsToolkit","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_3a0,local_398 + (long)local_3a0);
  VVar5 = VRDataIndex::getValue(config,(string *)local_408,&local_50,true);
  (*(VVar5.datum)->_vptr_VRDatum[2])(&local_350,VVar5.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_408._0_8_ != pcVar2) {
    operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
  }
  iVar4 = (*vrMain->_vptr_VRMainInterface[5])(vrMain,&local_350);
  local_378 = (VRGraphicsToolkit *)CONCAT44(extraout_var,iVar4);
  if (local_378 == (VRGraphicsToolkit *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot get the graphics toolkit named: ",0x27);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_350,local_348);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  local_408._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_408,"WindowToolkit","");
  pcVar3 = (nameSpace->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + nameSpace->_M_string_length);
  VVar5 = VRDataIndex::getValue(config,(string *)local_408,&local_70,true);
  (*(VVar5.datum)->_vptr_VRDatum[2])(&local_370,VVar5.datum);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_408._0_8_ != pcVar2) {
    operator_delete((void *)local_408._0_8_,CONCAT71(local_408._17_7_,local_408[0x10]) + 1);
  }
  iVar4 = (*vrMain->_vptr_VRMainInterface[6])(vrMain,&local_370);
  local_380 = (VRWindowToolkit *)CONCAT44(extraout_var_00,iVar4);
  if (local_380 == (VRWindowToolkit *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot get the window toolkit named: ",0x25);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_370,local_368);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
  }
  local_3f0 = (string  [8])&local_3e0;
  local_3e8 = 0;
  local_3e0._M_local_buf[0] = '\0';
  paVar1 = &local_448.field_2;
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"XPos","");
  local_428._M_dataplus._M_p._0_4_ = 100;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_90,true);
  local_408._0_4_ = iVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"YPos","");
  local_428._M_dataplus._M_p._0_4_ = 100;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_b0,true);
  local_408._4_4_ = iVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Width","");
  local_428._M_dataplus._M_p._0_4_ = 0x280;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_408._8_4_ =
       VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Height","");
  local_428._M_dataplus._M_p._0_4_ = 0x280;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_408._12_4_ =
       VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Border","");
  local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffff00000000;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_110,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_110,true)
  ;
  local_408[0x10] = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Visible","");
  local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffff00000000;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_130,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_130,true)
  ;
  local_3cf = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"Caption","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"MinVR Window","");
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_170,pcVar2,pcVar2 + nameSpace->_M_string_length);
  VRDataIndex::getValueWithDefault<std::__cxx11::string>
            (&local_448,config,&local_428,&local_150,&local_170,true);
  std::__cxx11::string::operator=(local_3f0,(string *)&local_448);
  paVar1 = &local_448.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"QuadBuffered","");
  local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffff00000000;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_190,true)
  ;
  local_3d0 = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"SharedContextGroupID","");
  local_428._M_dataplus._M_p._0_4_ = 0xffffffff;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1b0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3cc = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_1b0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ContextVersionMajor","");
  local_428._M_dataplus._M_p._0_4_ = 1;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3c8 = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_1d0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"ContextVersionMinor","");
  local_428._M_dataplus._M_p._0_4_ = 2;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3c4 = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_1f0,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"RGBBits","");
  local_428._M_dataplus._M_p._0_4_ = 8;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_210,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3c0 = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_210,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"AlphaBits","");
  local_428._M_dataplus._M_p._0_4_ = 8;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3bc = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_230,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"DepthBits","");
  local_428._M_dataplus._M_p._0_4_ = 0x18;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3b8 = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_250,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"StencilBits","");
  local_428._M_dataplus._M_p._0_4_ = 8;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3b4 = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_270,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"FullScreen","");
  local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffff00000000;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_290,true)
  ;
  local_3b0 = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"Resizable","");
  local_428._M_dataplus._M_p._0_4_ = 1;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_2b0,true)
  ;
  local_3af = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
    operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"AllowMaximize","");
  local_428._M_dataplus._M_p._0_4_ = 1;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_2d0,true)
  ;
  local_3ae = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
    operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"UseGPUAffinity","");
  local_428._M_dataplus._M_p._0_4_ = 1;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2f0,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_2f0,true)
  ;
  local_3ad = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"UseDebugContext","");
  local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffff00000000;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_310,pcVar2,pcVar2 + nameSpace->_M_string_length);
  iVar4 = VRDataIndex::getValueWithDefault<int>(config,&local_448,(int *)&local_428,&local_310,true)
  ;
  local_3ac = iVar4 != 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  local_448._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"MSAASamples","");
  local_428._M_dataplus._M_p = local_428._M_dataplus._M_p & 0xffffffff00000000;
  pcVar2 = (nameSpace->_M_dataplus)._M_p;
  local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_330,pcVar2,pcVar2 + nameSpace->_M_string_length);
  local_3a8 = VRDataIndex::getValueWithDefault<int>
                        (config,&local_448,(int *)&local_428,&local_330,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  gfxToolkit = local_378;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != paVar1) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  this = (VRGraphicsWindowNode *)operator_new(0xf8);
  VRGraphicsWindowNode(this,nameSpace,gfxToolkit,local_380,(VRWindowSettings *)local_408);
  if (local_3f0 != (string  [8])&local_3e0) {
    operator_delete((void *)local_3f0,
                    CONCAT71(local_3e0._M_allocated_capacity._1_7_,local_3e0._M_local_buf[0]) + 1);
  }
  if (local_370 != local_360) {
    operator_delete(local_370,local_360[0] + 1);
  }
  if (local_350 != local_340) {
    operator_delete(local_350,local_340[0] + 1);
  }
  if (local_3a0 != local_390) {
    operator_delete(local_3a0,local_390[0] + 1);
  }
  return &this->super_VRDisplayNode;
}

Assistant:

VRDisplayNode* VRGraphicsWindowNode::create(VRMainInterface *vrMain, VRDataIndex *config, const std::string &nameSpace)
{
  std::string nodeNameSpace = nameSpace;

    std::string gtk = config->getValue("GraphicsToolkit", nodeNameSpace);
  VRGraphicsToolkit *gfxToolkit = vrMain->getGraphicsToolkit(gtk);
    if (gfxToolkit == NULL) {
      std::cerr << "Cannot get the graphics toolkit named: " << gtk << std::endl;
    }

  std::string wtk = config->getValue("WindowToolkit", nameSpace);
    VRWindowToolkit *winToolkit = vrMain->getWindowToolkit(wtk);
    if (winToolkit == NULL) {
      std::cerr << "Cannot get the window toolkit named: " << wtk << std::endl;
    }

  VRWindowSettings settings;
  settings.xpos = config->getValueWithDefault("XPos", 100, nameSpace);
  settings.ypos = config->getValueWithDefault("YPos", 100, nameSpace);
  settings.width = config->getValueWithDefault("Width", 640, nameSpace);
  settings.height = config->getValueWithDefault("Height", 640, nameSpace);
  settings.border = (int)config->getValueWithDefault("Border", 0, nameSpace);
  settings.visible = (int)config->getValueWithDefault("Visible", 0, nameSpace);
  settings.caption = std::string(config->getValueWithDefault("Caption", std::string("MinVR Window"), nameSpace));
  settings.quadBuffered = (int)config->getValueWithDefault("QuadBuffered", 0, nameSpace);
  settings.sharedContextGroupID = int(config->getValueWithDefault("SharedContextGroupID", -1, nameSpace));
  settings.contextVersionMajor = int(config->getValueWithDefault("ContextVersionMajor", 1, nameSpace));
  settings.contextVersionMinor = int(config->getValueWithDefault("ContextVersionMinor", 2, nameSpace));
  settings.rgbBits = int(config->getValueWithDefault("RGBBits", 8, nameSpace));
  settings.alphaBits = int(config->getValueWithDefault("AlphaBits", 8, nameSpace));
  settings.depthBits = int(config->getValueWithDefault("DepthBits", 24, nameSpace));
  settings.stencilBits = int(config->getValueWithDefault("StencilBits", 8, nameSpace));
  settings.fullScreen = int(config->getValueWithDefault("FullScreen", 0, nameSpace));
  settings.resizable = int(config->getValueWithDefault("Resizable", 1, nameSpace));
  settings.allowMaximize = int(config->getValueWithDefault("AllowMaximize", 1, nameSpace));
  settings.gpuAffinity = int(config->getValueWithDefault("UseGPUAffinity", 1, nameSpace));
  settings.debugContext = int(config->getValueWithDefault("UseDebugContext", 0, nameSpace));
  settings.msaaSamples = int(config->getValueWithDefault("MSAASamples", 0, nameSpace));

  //  std::cout << "Window corners: " << settings.xpos << ", " << settings.ypos << ", " << settings.width << ", " << settings.height << std::endl;

  VRDisplayNode *node = new VRGraphicsWindowNode(nameSpace, gfxToolkit, winToolkit, settings);

  return node;
}